

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignmentExpressions.cpp
# Opt level: O0

Expression *
slang::ast::SimpleAssignmentPatternExpression::forDynamicArray
          (Compilation *comp,SimpleAssignmentPatternSyntax *syntax,ASTContext *context,Type *type,
          Type *elementType,SourceRange sourceRange)

{
  SourceRange sourceRange_00;
  SourceRange *args_2;
  SimpleAssignmentPatternExpression *result;
  undefined1 local_50 [8];
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> elems;
  bool bad;
  Type *elementType_local;
  Type *type_local;
  ASTContext *context_local;
  SimpleAssignmentPatternSyntax *syntax_local;
  Compilation *comp_local;
  
  args_2 = &sourceRange;
  elems.size_._7_1_ = 0;
  sourceRange_00.endLoc = (SourceLocation)((long)&elems.size_ + 7);
  sourceRange_00.startLoc = sourceRange.endLoc;
  _local_50 = bindExpressionList((ast *)type,elementType,(Type *)0x1,0,(int)syntax + 0x20,
                                 (SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *)context,
                                 (ASTContext *)sourceRange.startLoc,sourceRange_00,(bool *)args_2);
  comp_local = (Compilation *)
               BumpAllocator::
               emplace<slang::ast::SimpleAssignmentPatternExpression,slang::ast::Type_const&,nonstd::span_lite::span<slang::ast::Expression_const*const,18446744073709551615ul>&,slang::SourceRange&>
                         (&comp->super_BumpAllocator,type,
                          (span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)
                          local_50,args_2);
  if ((elems.size_._7_1_ & 1) != 0) {
    comp_local = (Compilation *)Expression::badExpr(comp,(Expression *)comp_local);
  }
  return (Expression *)comp_local;
}

Assistant:

Expression& SimpleAssignmentPatternExpression::forDynamicArray(
    Compilation& comp, const SimpleAssignmentPatternSyntax& syntax, const ASTContext& context,
    const Type& type, const Type& elementType, SourceRange sourceRange) {

    bool bad = false;
    auto elems = bindExpressionList(type, elementType, 1, 0, syntax.items, context, sourceRange,
                                    bad);

    auto result = comp.emplace<SimpleAssignmentPatternExpression>(type, elems, sourceRange);
    if (bad)
        return badExpr(comp, result);

    return *result;
}